

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::destroy_cocycle(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                  *this,Simplex_handle *sigma,A_ds_type *a_ds,Simplex_key death_key,
                 Arith_element inv_x,Arith_element charac)

{
  uint uVar1;
  pointer target;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this_00;
  list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *this_01;
  undefined4 uVar2;
  undefined4 x;
  bool bVar3;
  Element w_00;
  Element EVar4;
  int iVar5;
  Simplex_key key;
  pointer pPVar6;
  mapped_type *pmVar7;
  pointer pPVar8;
  reference pPVar9;
  reference ppPVar10;
  pointer ppVar11;
  list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
  *r;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_100;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *local_f8;
  uint local_ec;
  reference pPStack_e8;
  Simplex_key key_tmp;
  Persistent_cohomology_cell<unsigned_int,_int> *col_cell_1;
  iterator __end0_1;
  iterator __begin0_1;
  Col_type *__range7;
  undefined1 local_b8 [16];
  tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_true>
  local_a8;
  reference local_a0;
  Persistent_cohomology_cell<unsigned_int,_int> *col_cell;
  iterator __end0;
  iterator __begin0;
  Col_type *__range5;
  Column *curr_col;
  undefined1 local_70 [4];
  Arith_element w;
  undefined1 local_68 [8];
  iterator row_cell_it;
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
  result_insert_cam;
  iterator death_key_row;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_40;
  undefined1 local_38 [20];
  Arith_element charac_local;
  Arith_element inv_x_local;
  Simplex_key death_key_local;
  A_ds_type *a_ds_local;
  Simplex_handle *sigma_local;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  local_38._12_4_ = charac;
  local_38._16_4_ = inv_x;
  charac_local = death_key;
  _inv_x_local = a_ds;
  a_ds_local = (A_ds_type *)sigma;
  sigma_local = (Simplex_handle *)this;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_38,
             (Simplex_key)this->cpx_);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator(&local_40,sigma);
  bVar3 = length_interval::operator()
                    (&this->interval_length_policy,(Simplex_handle *)local_38,&local_40);
  if (bVar3) {
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex
              ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&death_key_row,
               (Simplex_key)this->cpx_);
    std::
    vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
    ::
    emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int&>
              ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                *)&this->persistent_pairs_,
               (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                *)&death_key_row,sigma,(int *)(local_38 + 0xc));
  }
  result_insert_cam._8_8_ =
       std::
       map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
       ::find(&this->transverse_idx_,(key_type_conflict *)&charac_local);
  std::
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
  ::
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool,_true>
            ((pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
              *)&row_cell_it);
  std::
  _Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
                *)&result_insert_cam.second);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
  ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
           *)local_68);
  while( true ) {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
                  *)&result_insert_cam.second);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
    ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
           *)local_70);
    bVar3 = boost::intrusive::operator!=
                      ((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                        *)local_68,
                       (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                        *)local_70);
    x = local_38._16_4_;
    uVar2 = local_38._12_4_;
    if (!bVar3) break;
    pPVar6 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
             ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                           *)local_68);
    w_00 = Field_Zp::times_minus(&this->coeff_field_,x,pPVar6->coefficient_);
    EVar4 = Field_Zp::additive_identity(&this->coeff_field_);
    if (w_00 == EVar4) {
      boost::intrusive::
      list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
      ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                    *)local_68);
    }
    else {
      pPVar6 = boost::intrusive::
               list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
               ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                             *)local_68);
      target = pPVar6->self_col_;
      boost::intrusive::
      list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
      ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_false>
                    *)local_68);
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
               *)&__end0);
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
      ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
             *)&col_cell);
      while( true ) {
        r = (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
             *)&col_cell;
        bVar3 = boost::intrusive::operator!=(&__end0,r);
        if (!bVar3) break;
        local_a0 = boost::intrusive::
                   list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                   ::operator*(&__end0);
        boost::intrusive::
        generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistent_cohomology::cam_h_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
        ::unlink((generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Gudhi::persistent_cohomology::cam_h_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
                  *)local_a0,(char *)r);
        boost::intrusive::
        list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
        ::operator++(&__end0);
      }
      boost::intrusive::
      bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
      ::iterator_to((bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                     *)(local_b8 + 8),(reference)&this->cam_);
      boost::intrusive::
      tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_true>
      ::tree_iterator(&local_a8,(nonconst_iterator *)(local_b8 + 8));
      boost::intrusive::
      bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
      ::erase((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
               *)local_b8,(const_iterator *)&this->cam_);
      plus_equal_column(this,target,_inv_x_local,w_00);
      bVar3 = boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
              ::empty(&(target->col_).super_type);
      if (bVar3) {
        ppPVar10 = std::
                   vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                   ::operator[](&this->ds_repr_,(ulong)target->class_key_);
        *ppPVar10 = (value_type)0x0;
        Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_>
        ::destroy(&this->column_pool_,target);
      }
      else {
        boost::intrusive::
        set_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
        ::insert((set_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
                  *)&__range7,(reference)&this->cam_);
        std::
        pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
        ::operator=((pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
                     *)&row_cell_it,(type)&__range7);
        if (((byte)result_insert_cam.first.members_.nodeptr_ & 1) == 0) {
          uVar1 = target->class_key_;
          pPVar8 = boost::intrusive::
                   tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                   ::operator->((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                                 *)&row_cell_it);
          boost::disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
          link<unsigned_int>(&this->dsets_,uVar1,pPVar8->class_key_);
          local_ec = boost::
                     disjoint_sets<int_*,_unsigned_int_*,_boost::find_with_full_path_compression>::
                     find_set<unsigned_int>(&this->dsets_,target->class_key_);
          pPVar9 = boost::intrusive::
                   tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                   ::operator*((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                                *)&row_cell_it);
          ppPVar10 = std::
                     vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                     ::operator[](&this->ds_repr_,(ulong)local_ec);
          uVar1 = local_ec;
          *ppPVar10 = pPVar9;
          pPVar8 = boost::intrusive::
                   tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                   ::operator->((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                                 *)&row_cell_it);
          pPVar8->class_key_ = uVar1;
          local_f8 = this;
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
          ::
          clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::destroy_cocycle(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>const&,unsigned_int,int,int)::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>*)_1_>
                    ((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
                      *)&target->col_,(anon_class_8_1_8991fb9c)this);
          Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_>
          ::destroy(&this->column_pool_,target);
        }
        else {
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
          ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
                   *)&__end0_1);
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
          ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
                 *)&col_cell_1);
          while (bVar3 = boost::intrusive::operator!=
                                   (&__end0_1,
                                    (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                                     *)&col_cell_1), bVar3) {
            pPStack_e8 = boost::intrusive::
                         list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                         ::operator*(&__end0_1);
            pmVar7 = std::
                     map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                     ::operator[](&this->transverse_idx_,&pPStack_e8->key_);
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
            ::push_front(&pmVar7->row_->super_type,pPStack_e8);
            boost::intrusive::
            list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
            ::operator++(&__end0_1);
          }
        }
      }
    }
  }
  iVar5 = Field_Zp::characteristic(&this->coeff_field_);
  if (uVar2 == iVar5) {
    this_00 = this->cpx_;
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_100,sigma);
    key = Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::null_key();
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_key(this_00,&local_100,key);
  }
  ppVar11 = std::
            _Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
                          *)&result_insert_cam.second);
  uVar2 = local_38._12_4_;
  if ((ppVar11->second).characteristics_ == local_38._12_4_) {
    ppVar11 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
                            *)&result_insert_cam.second);
    this_01 = (ppVar11->second).row_;
    if (this_01 !=
        (list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
         *)0x0) {
      boost::intrusive::
      list<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistent_cohomology::cam_h_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
      ::~list(this_01);
      operator_delete(this_01,0x10);
    }
    std::
    map<unsigned_int,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
    ::erase_abi_cxx11_((map<unsigned_int,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
                        *)&this->transverse_idx_,(iterator)result_insert_cam._8_8_);
  }
  else {
    ppVar11 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
                            *)&result_insert_cam.second);
    (ppVar11->second).characteristics_ = (ppVar11->second).characteristics_ / (int)uVar2;
  }
  return;
}

Assistant:

void destroy_cocycle(Simplex_handle sigma, A_ds_type const& a_ds,
                       Simplex_key death_key, Arith_element inv_x,
                       Arith_element charac) {
    // Create a finite persistent interval for which the interval exists
    if (interval_length_policy(cpx_->simplex(death_key), sigma)) {
      persistent_pairs_.emplace_back(cpx_->simplex(death_key)  // creator
          , sigma                                              // destructor
          , charac);                                           // fields
    }

    auto death_key_row = transverse_idx_.find(death_key);  // Find the beginning of the row.
    std::pair<typename Cam::iterator, bool> result_insert_cam;

    auto row_cell_it = death_key_row->second.row_->begin();

    while (row_cell_it != death_key_row->second.row_->end()) {  // Traverse all cells in
      // the row at index death_key.
      Arith_element w = coeff_field_.times_minus(inv_x, row_cell_it->coefficient_);

      if (w != coeff_field_.additive_identity()) {
        Column * curr_col = row_cell_it->self_col_;
        ++row_cell_it;
        // Disconnect the column from the rows in the CAM.
        for (auto& col_cell : curr_col->col_) {
          col_cell.base_hook_cam_h::unlink();
        }

        // Remove the column from the CAM before modifying its value
        cam_.erase(cam_.iterator_to(*curr_col));
        // Proceed to the reduction of the column
        plus_equal_column(*curr_col, a_ds, w);

        if (curr_col->col_.empty()) {  // If the column is null
          ds_repr_[curr_col->class_key_] = NULL;
          column_pool_.destroy(curr_col);  // delete curr_col;
        } else {
          // Find whether the column obtained is already in the CAM
          result_insert_cam = cam_.insert(*curr_col);
          if (result_insert_cam.second) {  // If it was not in the CAM before: insertion has succeeded
            for (auto& col_cell : curr_col->col_) {
              // re-establish the row links
              transverse_idx_[col_cell.key_].row_->push_front(col_cell);
            }
          } else {  // There is already an identical column in the CAM:
            // merge two disjoint sets.
            dsets_.link(curr_col->class_key_,
                        result_insert_cam.first->class_key_);

            Simplex_key key_tmp = dsets_.find_set(curr_col->class_key_);
            ds_repr_[key_tmp] = &(*(result_insert_cam.first));
            result_insert_cam.first->class_key_ = key_tmp;
            // intrusive containers don't own their elements, we have to release them manually
            curr_col->col_.clear_and_dispose([&](Cell*p){cell_pool_.destroy(p);});
            column_pool_.destroy(curr_col);  // delete curr_col;
          }
        }
      } else {
        ++row_cell_it;
      }  // If w == 0, pass.
    }

    // Because it is a killer simplex, set the data of sigma to null_key().
    if (charac == coeff_field_.characteristic()) {
      cpx_->assign_key(sigma, cpx_->null_key());
    }
    if (death_key_row->second.characteristics_ == charac) {
      delete death_key_row->second.row_;
      transverse_idx_.erase(death_key_row);
    } else {
      death_key_row->second.characteristics_ /= charac;
    }
  }